

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::TimeInfo::TimeInfo(TimeInfo *this,time_point now)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  tm *ptVar6;
  int iVar7;
  ulong uVar8;
  time_t raw_time;
  tm new_time;
  long local_50;
  tm local_48;
  
  local_50 = (long)now.__d.__r / 1000000000;
  ptVar6 = localtime_r(&local_50,&local_48);
  uVar1 = ptVar6->tm_mon;
  uVar2 = ptVar6->tm_year;
  this->year = uVar2 + 0x76c;
  this->month = uVar1 + 1;
  iVar7 = ptVar6->tm_sec;
  iVar4 = ptVar6->tm_min;
  iVar5 = ptVar6->tm_hour;
  uVar8 = (ulong)((long)now.__d.__r / 1000) / 1000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  this->day = ptVar6->tm_mday;
  this->hour = iVar5;
  this->min = iVar4;
  this->sec = iVar7;
  iVar7 = (int)uVar8;
  this->msec = iVar7 + SUB164(auVar3 * ZEXT816(0x4189374bc6a7f0),8) * -1000;
  this->usec = (int)((long)now.__d.__r / 1000) + iVar7 * -1000;
  return;
}

Assistant:

SimpleLoggerMgr::TimeInfo::TimeInfo(std::chrono::system_clock::time_point now) {
    std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
    std::tm new_time;

#if defined(__linux__) || defined(__APPLE__)
    std::tm* lt_tm = localtime_r(&raw_time, &new_time);

#elif defined(WIN32) || defined(_WIN32)
    localtime_s(&new_time, &raw_time);
    std::tm* lt_tm = &new_time;
#endif

    year =  lt_tm->tm_year + 1900;
    month = lt_tm->tm_mon + 1;
    day =   lt_tm->tm_mday;
    hour =  lt_tm->tm_hour;
    min =   lt_tm->tm_min;
    sec =   lt_tm->tm_sec;

    size_t us_epoch = std::chrono::duration_cast< std::chrono::microseconds >
                      ( now.time_since_epoch() ).count();
    msec = (us_epoch / 1000) % 1000;
    usec = us_epoch % 1000;
}